

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandEmpty(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    Abc_FrameDeleteAllNetworks(pAbc);
    Abc_FrameRestart(pAbc);
  }
  else {
    fprintf((FILE *)pAbc->Err,"usage: empty [-h]\n");
    fprintf((FILE *)pAbc->Err,"         removes all the currently stored networks\n");
    fprintf((FILE *)pAbc->Err,"   -h :  print the command usage\n");
  }
  pAbc_local._4_4_ = (uint)(iVar1 != -1);
  return pAbc_local._4_4_;
}

Assistant:

int CmdCommandEmpty( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    Abc_FrameDeleteAllNetworks( pAbc );
    Abc_FrameRestart( pAbc );
    return 0;
usage:

    fprintf( pAbc->Err, "usage: empty [-h]\n" );
    fprintf( pAbc->Err, "         removes all the currently stored networks\n" );
    fprintf( pAbc->Err, "   -h :  print the command usage\n");
    return 1;
}